

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O2

void thread1(void)

{
  Message MVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char str [64];
  
  put_str((char *)0x101419);
  uVar2 = 1;
  uVar4 = 0;
  do {
    if (the_thread->sched->shutdown_signal != false) {
      put_str((char *)0x1014a6);
      return;
    }
    iVar3 = (int)uVar4;
    snprintf(str,0x40,"[Thread 1] running: %d",uVar4);
    put_str((char *)0x101473);
    MVar1 = MsgFork;
    if ((uVar2 / 0x1e) * 0x1e + -1 == iVar3) {
LAB_00101488:
      message = MVar1;
    }
    else {
      MVar1 = MsgPing;
      if ((uVar2 / 6) * 6 + -1 == iVar3) goto LAB_00101488;
    }
    yield();
    uVar2 = uVar2 + 1;
    uVar4 = (ulong)(iVar3 + 1);
  } while( true );
}

Assistant:

static void
thread1(void)
{
    put_str("[Thread 1] started");
    int tok = 0;
    while (!shutting_down()) {
        char str[64];
        snprintf(str, sizeof str, "[Thread 1] running: %d", tok++);
        put_str(str);
        if (tok % 30 == 0)
            message = MsgFork;
        else if (tok % 6 == 0)
            message = MsgPing;
        yield();
    }
    put_str("[Thread 1] exiting");
}